

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

bool __thiscall pbrt::MediumHandle::IsEmissive(MediumHandle *this)

{
  ulong uVar1;
  short sVar2;
  long *plVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  sVar2 = (short)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 3) {
    plVar3 = (long *)(uVar1 & 0xffffffffffff);
    if (sVar2 == 2) {
      pfVar4 = *(float **)(*plVar3 + 0xa0);
      uVar1 = *(ulong *)(*plVar3 + 0xb0);
      if (1 < uVar1) {
        lVar5 = uVar1 * 4 + -4;
        pfVar7 = pfVar4;
        pfVar6 = pfVar4;
        do {
          pfVar6 = pfVar6 + 1;
          pfVar4 = pfVar6;
          if (*pfVar6 <= *pfVar7) {
            pfVar4 = pfVar7;
          }
          lVar5 = lVar5 + -4;
          pfVar7 = pfVar4;
        } while (lVar5 != 0);
      }
    }
    else {
      pfVar4 = (float *)plVar3[0xc];
      if (1 < (ulong)plVar3[0xe]) {
        lVar5 = plVar3[0xe] * 4 + -4;
        pfVar7 = pfVar4;
        pfVar6 = pfVar4;
        do {
          pfVar6 = pfVar6 + 1;
          pfVar4 = pfVar6;
          if (*pfVar6 <= *pfVar7) {
            pfVar4 = pfVar7;
          }
          lVar5 = lVar5 + -4;
          pfVar7 = pfVar4;
        } while (lVar5 != 0);
      }
    }
    return 0.0 < *pfVar4;
  }
  if (sVar2 != 3) {
    return 0.0 < *(float *)(*(long *)(uVar1 & 0xffffffffffff) + 0x68) &&
           *(long *)(*(long *)(uVar1 & 0xffffffffffff) + 0x60) != 0;
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }